

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O3

PipelineCreateInfo * __thiscall
vkt::Draw::PipelineCreateInfo::addState
          (PipelineCreateInfo *this,VkPipelineViewportStateCreateInfo *state)

{
  pointer pVVar1;
  pointer pVVar2;
  pointer pVVar3;
  pointer pVVar4;
  void *pvVar5;
  VkViewport *pVVar6;
  deUint32 dVar7;
  undefined4 uVar8;
  VkStructureType VVar9;
  undefined4 uVar10;
  allocator_type local_39;
  pointer local_38;
  pointer pVStack_30;
  pointer local_28;
  
  std::vector<vk::VkViewport,std::allocator<vk::VkViewport>>::vector<vk::VkViewport_const*,void>
            ((vector<vk::VkViewport,std::allocator<vk::VkViewport>> *)&local_38,state->pViewports,
             state->pViewports + state->viewportCount,&local_39);
  pVVar1 = (this->m_viewports).super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar2 = (this->m_viewports).super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_viewports).super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_start = local_38;
  (this->m_viewports).super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_finish = pVStack_30;
  (this->m_viewports).super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_28;
  local_38 = (pointer)0x0;
  pVStack_30 = (pointer)0x0;
  local_28 = (pointer)0x0;
  if (pVVar1 != (pointer)0x0) {
    operator_delete(pVVar1,(long)pVVar2 - (long)pVVar1);
    if (local_38 != (pointer)0x0) {
      operator_delete(local_38,(long)local_28 - (long)local_38);
    }
  }
  std::vector<vk::VkRect2D,std::allocator<vk::VkRect2D>>::vector<vk::VkRect2D_const*,void>
            ((vector<vk::VkRect2D,std::allocator<vk::VkRect2D>> *)&local_38,state->pScissors,
             state->pScissors + state->scissorCount,(allocator_type *)&local_39);
  pVVar3 = (this->m_scissors).super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar4 = (this->m_scissors).super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_scissors).super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_38;
  (this->m_scissors).super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)pVStack_30;
  (this->m_scissors).super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_28;
  local_38 = (pointer)0x0;
  pVStack_30 = (pointer)0x0;
  local_28 = (pointer)0x0;
  if (pVVar3 != (pointer)0x0) {
    operator_delete(pVVar3,(long)pVVar4 - (long)pVVar3);
    if (local_38 != (pointer)0x0) {
      operator_delete(local_38,(long)local_28 - (long)local_38);
    }
  }
  VVar9 = state->sType;
  uVar10 = *(undefined4 *)&state->field_0x4;
  pvVar5 = state->pNext;
  dVar7 = state->viewportCount;
  pVVar6 = state->pViewports;
  (this->m_viewportState).flags = state->flags;
  (this->m_viewportState).viewportCount = dVar7;
  (this->m_viewportState).pViewports = pVVar6;
  uVar8 = *(undefined4 *)&state->field_0x24;
  (this->m_viewportState).scissorCount = state->scissorCount;
  *(undefined4 *)&(this->m_viewportState).field_0x24 = uVar8;
  (this->m_viewportState).sType = VVar9;
  *(undefined4 *)&(this->m_viewportState).field_0x4 = uVar10;
  (this->m_viewportState).pNext = pvVar5;
  pVVar3 = (this->m_scissors).super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->m_viewportState).pViewports =
       (this->m_viewports).super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->m_viewportState).pScissors = pVVar3;
  (this->super_VkGraphicsPipelineCreateInfo).pViewportState = &this->m_viewportState;
  return this;
}

Assistant:

PipelineCreateInfo& PipelineCreateInfo::addState (const vk::VkPipelineViewportStateCreateInfo& state)
{
	m_viewports					= std::vector<vk::VkViewport>(state.pViewports, state.pViewports + state.viewportCount);
	m_scissors					= std::vector<vk::VkRect2D>(state.pScissors, state.pScissors + state.scissorCount);
	m_viewportState				= state;
	m_viewportState.pViewports	= &m_viewports[0];
	m_viewportState.pScissors	= &m_scissors[0];
	pViewportState				= &m_viewportState;

	return *this;
}